

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::test_xor_cardinality(void **param_1)

{
  roaring64_bitmap_t *file;
  roaring64_bitmap_t *prVar1;
  roaring64_bitmap_t *in_RDI;
  roaring64_bitmap_t *r2;
  roaring64_bitmap_t *r1;
  roaring64_bitmap_t *in_stack_00000070;
  int line;
  
  file = roaring64_bitmap_create();
  prVar1 = roaring64_bitmap_create();
  line = (int)((ulong)prVar1 >> 0x20);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_xor_cardinality((roaring64_bitmap_t *)r2,in_RDI);
  _assert_int_equal((unsigned_long)r2,(unsigned_long)in_RDI,(char *)file,line);
  roaring64_bitmap_free(in_stack_00000070);
  roaring64_bitmap_free(in_stack_00000070);
  return;
}

Assistant:

DEFINE_TEST(test_xor_cardinality) {
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    roaring64_bitmap_t* r2 = roaring64_bitmap_create();

    roaring64_bitmap_add(r1, 100000);
    roaring64_bitmap_add(r1, 100001);
    roaring64_bitmap_add(r1, 200000);
    roaring64_bitmap_add(r1, 300000);

    roaring64_bitmap_add(r2, 100001);
    roaring64_bitmap_add(r2, 200000);
    roaring64_bitmap_add(r2, 400000);

    assert_int_equal(roaring64_bitmap_xor_cardinality(r1, r2), 3);

    roaring64_bitmap_free(r1);
    roaring64_bitmap_free(r2);
}